

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O2

void helicsEndpointAddDestinationTarget(HelicsEndpoint end,char *targetEndpoint,HelicsError *err)

{
  Endpoint *this;
  EndpointObject *pEVar1;
  size_t sVar2;
  string_view newTarget;
  
  pEVar1 = anon_unknown.dwarf_8bada::verifyEndpoint(end,err);
  if (pEVar1 != (EndpointObject *)0x0) {
    this = pEVar1->endPtr;
    sVar2 = strlen(targetEndpoint);
    newTarget._M_str = targetEndpoint;
    newTarget._M_len = sVar2;
    helics::Interface::addDestinationTarget(&this->super_Interface,newTarget,UNKNOWN);
  }
  return;
}

Assistant:

void helicsEndpointAddDestinationTarget(HelicsEndpoint end, const char* targetEndpoint, HelicsError* err)
{
    auto* endObj = verifyEndpoint(end, err);
    if (endObj == nullptr) {
        return;
    }
    try {
        endObj->endPtr->addDestinationTarget(targetEndpoint);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}